

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool copyAndroidSources(Options *options)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QDir sourceDirectory;
  QDir local_30 [8];
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((options->androidSourceDirectory).d.size == 0) {
    bVar2 = true;
  }
  else {
    if (options->verbose == true) {
      fwrite("Copying Android sources from project.\n",0x26,1,_stdout);
    }
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QDir::QDir((QDir *)&local_28,&options->androidSourceDirectory);
    cVar1 = QDir::exists();
    if (cVar1 == '\0') {
      copyAndroidSources();
      bVar2 = false;
    }
    else {
      QDir::QDir(local_30,&options->outputDirectory);
      bVar2 = copyFiles((QDir *)&local_28,local_30,options,true);
      QDir::~QDir(local_30);
    }
    QDir::~QDir((QDir *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool copyAndroidSources(const Options &options)
{
    if (options.androidSourceDirectory.isEmpty())
        return true;

    if (options.verbose)
        fprintf(stdout, "Copying Android sources from project.\n");

    QDir sourceDirectory(options.androidSourceDirectory);
    if (!sourceDirectory.exists()) {
        fprintf(stderr, "Cannot find android sources in %s", qPrintable(options.androidSourceDirectory));
        return false;
    }

    return copyFiles(sourceDirectory, QDir(options.outputDirectory), options, true);
}